

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O3

int __thiscall
axl::sys::NameableEventBase<axl::sl::True>::close(NameableEventBase<axl::sl::True> *this,int __fd)

{
  int in_EAX;
  BufHdr *extraout_RAX;
  BufHdr *pBVar1;
  pthread_cond_t *__cond;
  
  __cond = (pthread_cond_t *)this->m_event;
  if (__cond == (pthread_cond_t *)0x0) {
    return in_EAX;
  }
  if (__cond != (pthread_cond_t *)&this->field_3) {
    if ((this->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length == 0)
    goto LAB_0011cbbe;
    io::psx::SharedMemory::unlink((char *)&this->m_name);
    __cond = (pthread_cond_t *)this->m_event;
  }
  pthread_mutex_destroy((pthread_mutex_t *)(__cond + 1));
  pthread_cond_destroy(__cond);
LAB_0011cbbe:
  io::psx::Mapping::unmap(&this->m_mapping,(this->m_mapping).m_size);
  pBVar1 = (this->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr;
  if (pBVar1 != (BufHdr *)0x0) {
    if ((pBVar1->super_RefCount).m_refCount == 1) {
      (this->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p =
           (C *)(pBVar1 + 1);
      *(undefined1 *)&pBVar1[1].super_RefCount._vptr_RefCount = 0;
      (this->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length = 0;
    }
    else {
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                (&(this->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
      pBVar1 = extraout_RAX;
    }
  }
  this->m_event = (EventImpl *)0x0;
  return (int)pBVar1;
}

Assistant:

void
	close() {
		if (!m_event)
			return;

		if (m_event == (EventImpl*)m_unnamedEventBuffer) {
			m_event->~EventImpl();
		} else if (!m_name.isEmpty()) {
			io::psx::SharedMemory::unlink(m_name);
			m_event->~EventImpl();
		}

		m_mapping.close();
		m_name.clear();
		m_event = NULL;
	}